

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# grammar.cpp
# Opt level: O1

bool Grammar::is_spaces(string *str)

{
  string local_28;
  
  str_utils::ltrim(&local_28,str);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_28._M_dataplus._M_p != &local_28.field_2) {
    operator_delete(local_28._M_dataplus._M_p);
  }
  return local_28._M_string_length == 0;
}

Assistant:

bool Grammar::is_spaces(const std::string& str) {
    return str_utils::ltrim(str).size() == 0;
}